

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFPageDocumentHelper::addPage
          (QPDFPageDocumentHelper *this,QPDFPageObjectHelper *newpage,bool first)

{
  QPDF *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  this_00 = (this->super_QPDFDocumentHelper).qpdf;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(newpage->super_QPDFObjectHelper).super_BaseHandle);
  QPDF::addPage(this_00,(QPDFObjectHandle *)&_Stack_28,first);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::addPage(QPDFPageObjectHelper newpage, bool first)
{
    this->qpdf.addPage(newpage.getObjectHandle(), first);
}